

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O0

int __thiscall dlib::rand::init(rand *this,EVP_PKEY_CTX *ctx)

{
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 10000; iVar1 = iVar1 + 1) {
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::operator()((mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
                  *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  this->max_val = 16777215.0;
  this->max_val = this->max_val * 16777216.0;
  this->max_val = this->max_val + 16777215.0;
  this->max_val = this->max_val + 0.05;
  this->has_gaussian = false;
  this->next_gaussian = 0.0;
  return (int)this;
}

Assistant:

void init()
            {
                // prime the generator a bit
                for (int i = 0; i < 10000; ++i)
                    mt();

                max_val =  0xFFFFFF;
                max_val *= 0x1000000;
                max_val += 0xFFFFFF;
                max_val += 0.05;


                has_gaussian = false;
                next_gaussian = 0;
            }